

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMocker<void_(int)>::PerformAction
          (FunctionMocker<void_(int)> *this,void *untyped_action,ArgumentTuple *args,
          string *call_description)

{
  Action<void_(int)> action;
  _Head_base<0UL,_int,_false> local_34;
  function<void_(int)> local_30;
  
  if (untyped_action != (void *)0x0) {
    std::function<void_(int)>::function(&local_30,(function<void_(int)> *)untyped_action);
    local_34._M_head_impl =
         (args->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>._M_head_impl;
    Action<void_(int)>::Perform((Action<void_(int)> *)&local_30,(ArgumentTuple *)&local_34);
    std::_Function_base::~_Function_base(&local_30.super__Function_base);
    return;
  }
  PerformDefaultAction(this,args,call_description);
  return;
}

Assistant:

R PerformAction(const void* untyped_action, ArgumentTuple&& args,
                  const std::string& call_description) const {
    if (untyped_action == nullptr) {
      return PerformDefaultAction(std::move(args), call_description);
    }

    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    return action.Perform(std::move(args));
  }